

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

size_t pbrt::
       FindInterval<pbrt::SampleCatmullRom(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float*,float*)::__0>
                 (size_t sz,anon_class_16_2_94731ad8 *pred)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RDI;
  bool predResult;
  size_t middle;
  size_t half;
  ssize_t first;
  ssize_t size;
  ulong in_stack_ffffffffffffffb8;
  anon_class_16_2_94731ad8 *in_stack_ffffffffffffffc0;
  anon_class_16_2_94731ad8 *local_20;
  ulong local_18;
  
  local_20 = (anon_class_16_2_94731ad8 *)0x1;
  uVar2 = in_RDI - 2;
  while (local_18 = uVar2, 0 < (long)local_18) {
    uVar2 = local_18 >> 1;
    bVar1 = SampleCatmullRom::anon_class_16_2_94731ad8::operator()
                      (in_stack_ffffffffffffffc0,(int)(in_stack_ffffffffffffffb8 >> 0x20));
    in_stack_ffffffffffffffb8 = uVar2;
    in_stack_ffffffffffffffc0 = local_20;
    if (bVar1) {
      in_stack_ffffffffffffffc0 = (anon_class_16_2_94731ad8 *)((long)&local_20->F + uVar2 + 1);
      in_stack_ffffffffffffffb8 = local_18 - (uVar2 + 1);
      local_20 = in_stack_ffffffffffffffc0;
      uVar2 = in_stack_ffffffffffffffb8;
    }
  }
  sVar3 = Clamp<long,int,unsigned_long>((long)((long)&local_20[-1].u + 7),0,in_RDI - 2);
  return sVar3;
}

Assistant:

PBRT_CPU_GPU inline size_t FindInterval(size_t sz, const Predicate &pred) {
    using ssize_t = std::make_signed_t<size_t>;
    ssize_t size = (ssize_t)sz - 2, first = 1;
    while (size > 0) {
        // Evaluate predicate at midpoint and update _first_ and _size_
        size_t half = (size_t)size >> 1, middle = first + half;
        bool predResult = pred(middle);
        first = predResult ? middle + 1 : first;
        size = predResult ? size - (half + 1) : half;
    }
    return (size_t)Clamp((ssize_t)first - 1, 0, sz - 2);
}